

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O0

APInt * __thiscall llvm::APInt::operator=(APInt *this,uint64_t RHS)

{
  uint64_t uVar1;
  bool bVar2;
  uint uVar3;
  uint64_t RHS_local;
  APInt *this_local;
  
  bVar2 = isSingleWord(this);
  if (bVar2) {
    (this->U).VAL = RHS;
    clearUnusedBits(this);
  }
  else {
    *(this->U).pVal = RHS;
    uVar1 = (this->U).VAL;
    uVar3 = getNumWords(this);
    memset((void *)(uVar1 + 8),0,(ulong)((uVar3 - 1) * 8));
  }
  return this;
}

Assistant:

APInt &operator=(uint64_t RHS) {
    if (isSingleWord()) {
      U.VAL = RHS;
      clearUnusedBits();
    } else {
      U.pVal[0] = RHS;
      memset(U.pVal+1, 0, (getNumWords() - 1) * APINT_WORD_SIZE);
    }
    return *this;
  }